

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::BufferStorage::ErrorsTest::verifyError
          (ErrorsTest *this,GLenum expected_error,GLchar *error_message,bool *out_test_result)

{
  int iVar1;
  GLenum value;
  undefined4 extraout_var;
  char *pcVar2;
  size_t sVar3;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (value != expected_error) {
    *out_test_result = false;
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Got invalid error: ",0x13);
    pcVar2 = glu::getErrorName(value);
    iVar1 = (int)(ostringstream *)&local_1a0;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", expected: ",0xc);
    pcVar2 = glu::getErrorName(expected_error);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,". Message: ",0xb);
    if (error_message == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(error_message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,error_message,sVar3);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void ErrorsTest::verifyError(glw::GLenum expected_error, const glw::GLchar* error_message, bool& out_test_result)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLenum error = gl.getError();

	if (error != expected_error)
	{
		out_test_result = false;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Got invalid error: " << glu::getErrorName(error)
			<< ", expected: " << glu::getErrorName(expected_error) << ". Message: " << error_message
			<< tcu::TestLog::EndMessage;
	}
}